

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_baichuan::llm_build_baichuan
          (llm_build_baichuan *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  undefined8 uVar1;
  undefined8 uVar2;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  const_reference pvVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  pointer plVar12;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  int in_stack_00000010;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffde8;
  int iVar13;
  llm_graph_context *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffe08;
  undefined4 uVar14;
  llm_graph_context *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *cur_01;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffea8;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *act_scales;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ggml_tensor *local_b0;
  ggml_tensor *local_78;
  undefined8 local_70;
  ggml_tensor *local_68;
  int local_5c;
  ggml_tensor *pgVar15;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_cgraph *in_stack_ffffffffffffffd0;
  
  pgVar15 = in_RDI;
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe00,
             (llm_graph_params *)in_stack_fffffffffffffdf8);
  inp = (llm_graph_input_attn_kv_unified *)(ulong)*(uint *)(in_RDI->buffer + 0x24);
  if (inp != (llm_graph_input_attn_kv_unified *)(ulong)*(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x12cb,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (inp == (llm_graph_input_attn_kv_unified *)(ulong)*(uint *)(in_RDI->buffer + 0x14)) {
    local_68 = llm_graph_context::build_inp_embd
                         ((llm_graph_context *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8);
    if (in_RSI->type == GGML_TYPE_TQ1_0) {
      local_b0 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe50);
    }
    else {
      local_b0 = (ggml_tensor *)0x0;
    }
    pgVar3 = (ggml_tensor *)
             llm_graph_context::build_attn_inp_kv_unified
                       ((llm_graph_context *)in_stack_fffffffffffffe90);
    local_5c = 0;
    do {
      iVar13 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      if (in_RDI->ne[3] <= (long)local_5c) {
        pgVar3 = llm_graph_context::build_norm
                           (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                            in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                            (int)in_stack_fffffffffffffdf0);
        pgVar15 = pgVar3;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                   (char *)in_stack_fffffffffffffdf0,iVar13);
        plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::
                  operator->((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *
                             )0x4c1fa5);
        plVar12->t_embd = pgVar15;
        pgVar3 = llm_graph_context::build_lora_mm
                           ((llm_graph_context *)in_stack_fffffffffffffe50,pgVar3,
                            in_stack_fffffffffffffe40);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                   (char *)in_stack_fffffffffffffdf0,iVar13);
        pgVar15 = pgVar3;
        plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::
                  operator->((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *
                             )0x4c202a);
        plVar12->t_logits = pgVar3;
        ggml_build_forward_expand(in_RCX,pgVar15);
        return;
      }
      pgVar9 = local_68;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
                 (long)local_5c);
      pgVar4 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                          (int)in_stack_fffffffffffffdf0);
      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
                 (long)local_5c);
      pgVar5 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                          in_stack_fffffffffffffe40);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
                 (long)local_5c);
      pgVar6 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                          in_stack_fffffffffffffe40);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
                 (long)local_5c);
      pgVar7 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                          in_stack_fffffffffffffe40);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      local_70 = ggml_reshape_3d(in_RDI->src[5],pgVar5,inp,in_RDI->nb[3],
                                 (long)*(int *)(in_RDI->src + 2));
      uVar1._0_4_ = in_RDI->op;
      uVar1._4_4_ = in_RDI->op_params[0];
      local_78 = (ggml_tensor *)
                 ggml_reshape_3d(in_RDI->src[5],pgVar6,inp,uVar1,(long)*(int *)(in_RDI->src + 2));
      uVar2._0_4_ = in_RDI->op;
      uVar2._4_4_ = in_RDI->op_params[0];
      pgVar5 = (ggml_tensor *)
               ggml_reshape_3d(in_RDI->src[5],pgVar7,inp,uVar2,(long)*(int *)(in_RDI->src + 2));
      if (in_RSI->type == GGML_TYPE_TQ1_0) {
        local_70 = ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],
                                 in_RDI->op_params[0xf],in_RDI->flags,*(undefined4 *)in_RDI->src,
                                 *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],local_70,
                                 local_b0,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
        local_78 = (ggml_tensor *)
                   ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],
                                 in_RDI->op_params[0xf],in_RDI->flags,*(undefined4 *)in_RDI->src,
                                 *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],local_78,
                                 local_b0,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
        pgVar6 = in_RCX;
      }
      else {
        pgVar6 = in_RCX;
        if (in_RSI->type != GGML_TYPE_COUNT) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                     ,0x12ff,"fatal error");
        }
      }
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,iVar13);
      act_scales = pgVar3;
      in_RCX = pgVar6;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                          &in_RSI[0x13].view_offs,(long)local_5c);
      type_op = (llm_ffn_op_type)pgVar6;
      type_gate = (llm_ffn_gate_type)pvVar8->wo;
      sqrtf((float)(long)inp);
      pgVar11 = (ggml_tensor *)CONCAT44(uVar14,local_5c);
      mw = (ggml_tensor *)0x0;
      cur_00 = (ggml_tensor *)0x0;
      pgVar6 = pgVar5;
      pgVar7 = local_78;
      pgVar9 = llm_graph_context::build_attn
                         ((llm_graph_context *)in_RCX,inp,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffc8,pgVar4,pgVar9,in_RSI,pgVar15,unaff_retaddr,
                          in_stack_00000008,(float)((ulong)local_b0 >> 0x20),in_stack_00000010);
      iVar13 = (int)((ulong)local_78 >> 0x20);
      if ((long)local_5c == in_RDI->ne[3] + -1) {
        pgVar4 = llm_graph_context::build_inp_out_ids
                           ((llm_graph_context *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffeb0 = pgVar4;
        in_stack_fffffffffffffea8 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar9,pgVar4);
        pgVar9 = in_stack_fffffffffffffea8;
        in_stack_fffffffffffffea0 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_68,pgVar4);
        local_68 = in_stack_fffffffffffffea0;
      }
      pgVar10 = (ggml_tensor *)ggml_add(in_RDI->src[5],pgVar9,local_68);
      llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar5,iVar13);
      cur_01 = pgVar10;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
                 (long)local_5c);
      pgVar11 = llm_graph_context::build_norm
                          (in_stack_fffffffffffffe10,pgVar11,mw,cur_00,
                           (llm_norm_type)((ulong)pgVar5 >> 0x20),(int)pgVar5);
      llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar5,iVar13);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                          &in_RSI[0x13].view_offs,(long)local_5c);
      pgVar9 = pvVar8->ffn_up;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                          &in_RSI[0x13].view_offs,(long)local_5c);
      pgVar4 = pvVar8->ffn_gate;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                          &in_RSI[0x13].view_offs,(long)local_5c);
      in_stack_fffffffffffffdf8 = pvVar8->ffn_down;
      in_stack_fffffffffffffe10 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffe08 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffe00 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffdf0 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffde8 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffe80 =
           llm_graph_context::build_ffn
                     ((llm_graph_context *)pgVar11,cur_01,in_stack_fffffffffffffe80,
                      (ggml_tensor *)&stack0xfffffffffffffde8,pgVar4,pgVar9,
                      in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                      pgVar6,pgVar7,act_scales,type_op,type_gate,(int)local_70);
      pgVar9 = in_stack_fffffffffffffe80;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      ggml_add(in_RDI->src[5],pgVar9,pgVar10);
      in_stack_fffffffffffffe50 =
           llm_graph_context::build_cvec(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
      local_68 = in_stack_fffffffffffffe50;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      local_5c = local_5c + 1;
    } while( true );
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x12cc,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
}

Assistant:

llm_build_baichuan(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = model.type == LLM_TYPE_7B ? build_inp_pos() : nullptr;

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                switch (model.type) {
                    case LLM_TYPE_7B:
                        Qcur = ggml_rope_ext(
                                ctx0, Qcur, inp_pos, nullptr,
                                n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                                ext_factor, attn_factor, beta_fast, beta_slow
                                );
                        Kcur = ggml_rope_ext(
                                ctx0, Kcur, inp_pos, nullptr,
                                n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                                ext_factor, attn_factor, beta_fast, beta_slow
                                );
                        break;
                    case LLM_TYPE_13B:
                        break;
                    default:
                        GGML_ABORT("fatal error");
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }